

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_circle_lines(int center_x,int center_y,float radius,rf_color color)

{
  rf_render_batch *prVar1;
  long lVar2;
  rf_vertex_buffer *prVar3;
  ulong uVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  
  prVar1 = (rf__ctx->field_0).current_batch;
  lVar2 = prVar1->current_buffer;
  prVar3 = prVar1->vertex_buffers;
  if (prVar3[lVar2].elements_count * 4 <= prVar3[lVar2].v_counter + 0x48) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_LINES);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  uVar4 = 0;
  do {
    fVar6 = sinf((float)(long)uVar4 * 0.017453292);
    fVar7 = cosf((float)(long)uVar4 * 0.017453292);
    rf_gfx_vertex3f(fVar6 * radius + (float)center_x,fVar7 * radius + (float)center_y,
                    ((rf__ctx->field_0).current_batch)->current_depth);
    fVar6 = (float)(long)(uVar4 + 10) * 0.017453292;
    fVar7 = sinf(fVar6);
    fVar6 = cosf(fVar6);
    rf_gfx_vertex3f(fVar7 * radius + (float)center_x,fVar6 * radius + (float)center_y,
                    ((rf__ctx->field_0).current_batch)->current_depth);
    bVar5 = uVar4 < 0x15e;
    uVar4 = uVar4 + 10;
  } while (bVar5);
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_circle_lines(int center_x, int center_y, float radius, rf_color color)
{
    if (rf_gfx_check_buffer_limit(2 * 36)) rf_gfx_draw();

    rf_gfx_begin(RF_LINES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    // NOTE: Circle outline is drawn pixel by pixel every degree (0 to 360)
    for (rf_int i = 0; i < 360; i += 10)
    {
        rf_gfx_vertex2f(center_x + sinf(RF_DEG2RAD*i)*radius, center_y + cosf(RF_DEG2RAD*i)*radius);
        rf_gfx_vertex2f(center_x + sinf(RF_DEG2RAD*(i + 10))*radius, center_y + cosf(RF_DEG2RAD*(i + 10))*radius);
    }
    rf_gfx_end();
}